

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

art_iterator_t * art_init_iterator(art_iterator_t *__return_storage_ptr__,art_t *art,_Bool first)

{
  memset(__return_storage_ptr__,0,0x90);
  __return_storage_ptr__->art = art;
  if (art->root != 0) {
    art_node_init_iterator(art->root,__return_storage_ptr__,first);
  }
  return __return_storage_ptr__;
}

Assistant:

art_iterator_t art_init_iterator(art_t *art, bool first) {
    art_iterator_t iterator = CROARING_ZERO_INITIALIZER;
    iterator.art = art;
    if (art->root == CROARING_ART_NULL_REF) {
        return iterator;
    }
    art_node_init_iterator(art->root, &iterator, first);
    return iterator;
}